

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_automaticIdAllItemsNoneDuplicated_Test::TestBody
          (Annotator_automaticIdAllItemsNoneDuplicated_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_9a0 [8];
  Message local_998 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  undefined1 local_970 [8];
  AssertionResult gtest_ar_22;
  Message local_958 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  undefined1 local_930 [8];
  AssertionResult gtest_ar_21;
  Message local_918 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  undefined1 local_8f0 [8];
  AssertionResult gtest_ar_20;
  Message local_8d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  undefined1 local_8b0 [8];
  AssertionResult gtest_ar_19;
  Message local_898 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  undefined1 local_870 [8];
  AssertionResult gtest_ar_18;
  Message local_858 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_850;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_17;
  Message local_818 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_16;
  Message local_7d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  undefined1 local_7b0 [8];
  AssertionResult gtest_ar_15;
  Message local_798 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_14;
  Message local_758 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_13;
  Message local_718 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  undefined1 local_6f0 [8];
  AssertionResult gtest_ar_12;
  Message local_6d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_11;
  Message local_698 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_10;
  Message local_658 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_650;
  shared_ptr<libcellml::Model> local_640;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_9;
  Message local_618 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_610;
  shared_ptr<libcellml::Model> local_600;
  undefined1 local_5f0 [8];
  AssertionResult gtest_ar_8;
  Message local_5d8 [8];
  shared_ptr<libcellml::Units> local_5d0;
  shared_ptr<const_libcellml::ParentedEntity> local_5c0;
  shared_ptr<libcellml::Model> local_5b0;
  undefined1 local_5a0 [8];
  AssertionResult gtest_ar_7;
  Message local_588 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_580;
  shared_ptr<libcellml::Model> local_570;
  undefined1 local_560 [8];
  AssertionResult gtest_ar_6;
  Message local_548 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_540;
  shared_ptr<libcellml::Model> local_530;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_5;
  Message local_508 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_500;
  shared_ptr<libcellml::Model> local_4f0;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_4;
  Message local_4c8 [8];
  shared_ptr<libcellml::Variable> local_4c0;
  shared_ptr<const_libcellml::ParentedEntity> local_4b0;
  shared_ptr<libcellml::Model> local_4a0;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_3;
  Message local_478 [8];
  shared_ptr<libcellml::Variable> local_470;
  shared_ptr<const_libcellml::ParentedEntity> local_460;
  shared_ptr<libcellml::Model> local_450;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_2;
  Message local_428 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_420;
  shared_ptr<libcellml::Model> local_410;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_1;
  Message local_3e8 [8];
  shared_ptr<const_libcellml::ParentedEntity> local_3e0;
  shared_ptr<libcellml::Model> local_3d0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar;
  string local_3a8 [32];
  shared_ptr<libcellml::Component> local_388;
  undefined1 local_378 [8];
  VariablePtr itemVariable;
  UnitsPtr itemUnits;
  undefined1 local_348 [8];
  UnitsItemPtr itemUnitsItem;
  string local_330 [32];
  shared_ptr<libcellml::Component> local_310;
  undefined1 local_300 [8];
  ResetPtr itemTestValue;
  string local_2e8 [32];
  shared_ptr<libcellml::Component> local_2c8;
  undefined1 local_2b8 [8];
  ResetPtr itemResetValue;
  string local_2a0 [32];
  shared_ptr<libcellml::Component> local_280;
  undefined1 local_270 [8];
  ResetPtr itemReset;
  ModelPtr itemModel;
  string local_248 [32];
  shared_ptr<libcellml::Component> local_228;
  shared_ptr<libcellml::Variable> local_218;
  shared_ptr<libcellml::Variable> local_208;
  allocator<char> local_1f1;
  string local_1f0 [32];
  shared_ptr<libcellml::Component> local_1d0;
  shared_ptr local_1c0 [16];
  undefined1 local_1b0 [8];
  VariablePairPtr itemMapVariables;
  string local_198 [32];
  shared_ptr<libcellml::Component> local_178;
  undefined1 local_168 [8];
  ImportSourcePtr itemImportSource;
  ModelPtr itemEncapsulation;
  string local_140 [32];
  shared_ptr<libcellml::Component> local_120;
  shared_ptr<libcellml::Variable> local_110;
  shared_ptr<libcellml::Variable> local_100;
  allocator<char> local_e9;
  string local_e8 [32];
  shared_ptr<libcellml::Component> local_c8;
  shared_ptr local_b8 [16];
  undefined1 local_a8 [8];
  VariablePairPtr itemConnection;
  string local_90 [32];
  undefined1 local_70 [8];
  ComponentPtr itemComponentEncapsulation;
  ComponentPtr itemComponent;
  AnnotatorPtr annotator;
  undefined1 local_30 [8];
  ModelPtr model;
  ParserPtr parser;
  Annotator_automaticIdAllItemsNoneDuplicated_Test *this_local;
  
  p_Var1 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(p_Var1,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             p_Var1);
  libcellml::Parser::parseModel((string *)local_30);
  libcellml::Annotator::create();
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::ComponentEntity::component
            ((ulong)&itemComponentEncapsulation.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_90,"component2",
             (allocator<char> *)
             ((long)&itemConnection.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)local_70,SUB81(peVar3,0));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemConnection.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"component2",&local_e9);
  libcellml::ComponentEntity::component((string *)&local_c8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_c8);
  libcellml::Component::variable((ulong)local_b8);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"component2",
             (allocator<char> *)
             ((long)&itemEncapsulation.
                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_120,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_120);
  libcellml::Component::variable((ulong)&local_110);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_110);
  libcellml::Variable::equivalentVariable((ulong)&local_100);
  libcellml::VariablePair::create((shared_ptr *)local_a8,local_b8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_100);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_110);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemEncapsulation.
                     super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr<libcellml::Model> *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"component1",
             (allocator<char> *)
             ((long)&itemMapVariables.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_178,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_178);
  libcellml::ImportedEntity::importSource();
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_178);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemMapVariables.
                     super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"component2",&local_1f1);
  libcellml::ComponentEntity::component((string *)&local_1d0,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1d0);
  libcellml::Component::variable((ulong)local_1c0);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_248,"component2",
             (allocator<char> *)
             ((long)&itemModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_228,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_228);
  libcellml::Component::variable((ulong)&local_218);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_218);
  libcellml::Variable::equivalentVariable((ulong)&local_208);
  libcellml::VariablePair::create((shared_ptr *)local_1b0,local_1c0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_208);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_218);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_228);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_1c0);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::shared_ptr<libcellml::Model>::shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(shared_ptr<libcellml::Model> *)local_30);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"component2",
             (allocator<char> *)
             ((long)&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_280,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_280);
  libcellml::Component::reset((ulong)local_270);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemResetValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2e8,"component2",
             (allocator<char> *)
             ((long)&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_2c8,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_2c8);
  libcellml::Component::reset((ulong)local_2b8);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_2c8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemTestValue.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_330,"component2",
             (allocator<char> *)
             ((long)&itemUnitsItem.
                     super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ComponentEntity::component((string *)&local_310,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_310);
  libcellml::Component::reset((ulong)local_300);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_310);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&itemUnitsItem.
                     super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units
            ((ulong)&itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  p_Var1 = &itemUnits.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::UnitsItem::create((shared_ptr *)local_348,(ulong)p_Var1);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)p_Var1);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  libcellml::Model::units
            ((ulong)&itemVariable.
                     super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"component2",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::ComponentEntity::component((string *)&local_388,SUB81(peVar3,0));
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_388);
  libcellml::Component::variable((ulong)local_378);
  std::shared_ptr<libcellml::Component>::~shared_ptr(&local_388);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::setModel((shared_ptr *)peVar4);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_3e0,
             (shared_ptr<libcellml::Component> *)
             &itemComponentEncapsulation.
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  owningModel((shared_ptr *)&local_3d0);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_3c0,"model","owningModel(itemComponent)",
             (shared_ptr<libcellml::Model> *)local_30,&local_3d0);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_3d0);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_3e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(local_3e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Component,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_420,
             (shared_ptr<libcellml::Component> *)local_70);
  owningModel((shared_ptr *)&local_410);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_400,"model","owningModel(itemComponentEncapsulation)",
             (shared_ptr<libcellml::Model> *)local_30,&local_410);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_410);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_420);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(local_428);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_a8);
  libcellml::VariablePair::variable1();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_460,&local_470);
  owningModel((shared_ptr *)&local_450);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_440,"model","owningModel(itemConnection->variable1())",
             (shared_ptr<libcellml::Model> *)local_30,&local_450);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_450);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_460);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_470);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar2) {
    testing::Message::Message(local_478);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  std::__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_1b0);
  libcellml::VariablePair::variable1();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_4b0,&local_4c0);
  owningModel((shared_ptr *)&local_4a0);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_490,"model","owningModel(itemMapVariables->variable1())",
             (shared_ptr<libcellml::Model> *)local_30,&local_4a0);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_4a0);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_4b0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_4c0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar2) {
    testing::Message::Message(local_4c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_500,
             (shared_ptr<libcellml::Reset> *)local_270);
  owningModel((shared_ptr *)&local_4f0);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_4e0,"model","owningModel(itemReset)",
             (shared_ptr<libcellml::Model> *)local_30,&local_4f0);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_4f0);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_500);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar2) {
    testing::Message::Message(local_508);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_508);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_540,
             (shared_ptr<libcellml::Reset> *)local_2b8);
  owningModel((shared_ptr *)&local_530);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_520,"model","owningModel(itemResetValue)",
             (shared_ptr<libcellml::Model> *)local_30,&local_530);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_530);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_540);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar2) {
    testing::Message::Message(local_548);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_548);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_548);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Reset,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_580,
             (shared_ptr<libcellml::Reset> *)local_300);
  owningModel((shared_ptr *)&local_570);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_560,"model","owningModel(itemTestValue)",
             (shared_ptr<libcellml::Model> *)local_30,&local_570);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_570);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_580);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_560);
  if (!bVar2) {
    testing::Message::Message(local_588);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_560);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_588);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_560);
  std::__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_348);
  libcellml::UnitsItem::units();
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_5c0,&local_5d0);
  owningModel((shared_ptr *)&local_5b0);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_5a0,"model","owningModel(itemUnitsItem->units())",
             (shared_ptr<libcellml::Model> *)local_30,&local_5b0);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_5b0);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_5c0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_5d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a0);
  if (!bVar2) {
    testing::Message::Message(local_5d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_5d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_5d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a0);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Units,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_610,
             (shared_ptr<libcellml::Units> *)
             &itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  owningModel((shared_ptr *)&local_600);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_5f0,"model","owningModel(itemUnits)",
             (shared_ptr<libcellml::Model> *)local_30,&local_600);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_600);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_610);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
  if (!bVar2) {
    testing::Message::Message(local_618);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a8,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_618);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  std::shared_ptr<libcellml::ParentedEntity_const>::shared_ptr<libcellml::Variable,void>
            ((shared_ptr<libcellml::ParentedEntity_const> *)&local_650,
             (shared_ptr<libcellml::Variable> *)local_378);
  owningModel((shared_ptr *)&local_640);
  testing::internal::EqHelper<false>::
  Compare<std::shared_ptr<libcellml::Model>,std::shared_ptr<libcellml::Model>>
            ((EqHelper<false> *)local_630,"model","owningModel(itemVariable)",
             (shared_ptr<libcellml::Model> *)local_30,&local_640);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_640);
  std::shared_ptr<const_libcellml::ParentedEntity>::~shared_ptr(&local_650);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar2) {
    testing::Message::Message(local_658);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_630);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5a9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_690,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_670,"\"b4da55\"","annotator->assignId(itemComponent)",
             (char (*) [7])"b4da55",&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar2) {
    testing::Message::Message(local_698);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5ac,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_698);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_698);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_6d0,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_6b0,"\"b4da56\"",
             "annotator->assignId(itemComponentEncapsulation)",(char (*) [7])"b4da56",&local_6d0);
  std::__cxx11::string::~string((string *)&local_6d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b0);
  if (!bVar2) {
    testing::Message::Message(local_6d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5ad,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_6d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_6d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b0);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_710,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_6f0,"\"b4da57\"","annotator->assignId(itemConnection)",
             (char (*) [7])"b4da57",&local_710);
  std::__cxx11::string::~string((string *)&local_710);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6f0);
  if (!bVar2) {
    testing::Message::Message(local_718);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5ae,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6f0);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_750,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_730,"\"b4da58\"","annotator->assignId(itemEncapsulation)",
             (char (*) [7])"b4da58",&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar2) {
    testing::Message::Message(local_758);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5af,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_758);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_758);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_790);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_770,"\"b4da59\"","annotator->assignId(itemImportSource)",
             (char (*) [7])"b4da59",&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar2) {
    testing::Message::Message(local_798);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_798);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_7d0,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7b0,"\"b4da5a\"","annotator->assignId(itemMapVariables)",
             (char (*) [7])"b4da5a",&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7b0);
  if (!bVar2) {
    testing::Message::Message(local_7d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_7d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7b0);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_810,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_7f0,"\"b4da5b\"","annotator->assignId(itemModel)",
             (char (*) [7])"b4da5b",&local_810);
  std::__cxx11::string::~string((string *)&local_810);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar2) {
    testing::Message::Message(local_818);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_850,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_830,"\"b4da5c\"","annotator->assignId(itemReset)",
             (char (*) [7])"b4da5c",&local_850);
  std::__cxx11::string::~string((string *)&local_850);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar2) {
    testing::Message::Message(local_858);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_858);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_858);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_890,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_870,"\"b4da5d\"","annotator->assignId(itemResetValue)",
             (char (*) [7])"b4da5d",&local_890);
  std::__cxx11::string::~string((string *)&local_890);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_870);
  if (!bVar2) {
    testing::Message::Message(local_898);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_870);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_870);
  peVar4 = std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&itemComponent.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_8d0,(CellmlElementType)peVar4);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8b0,"\"b4da5e\"","annotator->assignId(itemTestValue)",
             (char (*) [7])"b4da5e",&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b0);
  if (!bVar2) {
    testing::Message::Message(local_8d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_910);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_8f0,"\"b4da5f\"","annotator->assignId(itemUnitsItem)",
             (char (*) [7])"b4da5f",&local_910);
  std::__cxx11::string::~string((string *)&local_910);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8f0);
  if (!bVar2) {
    testing::Message::Message(local_918);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_918);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_918);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8f0);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_950);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_930,"\"b4da60\"","annotator->assignId(itemUnits)",
             (char (*) [7])"b4da60",&local_950);
  std::__cxx11::string::~string((string *)&local_950);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_930);
  if (!bVar2) {
    testing::Message::Message(local_958);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_930);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b7,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_958);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_958);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_930);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_990);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_970,"\"b4da61\"","annotator->assignId(itemVariable)",
             (char (*) [7])"b4da61",&local_990);
  std::__cxx11::string::~string((string *)&local_990);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_970);
  if (!bVar2) {
    testing::Message::Message(local_998);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_970);
    testing::internal::AssertHelper::AssertHelper
              (local_9a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x5b8,pcVar5);
    testing::internal::AssertHelper::operator=(local_9a0,local_998);
    testing::internal::AssertHelper::~AssertHelper(local_9a0);
    testing::Message::~Message(local_998);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_970);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_378);
  std::shared_ptr<libcellml::Units>::~shared_ptr
            ((shared_ptr<libcellml::Units> *)
             &itemVariable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr((shared_ptr<libcellml::UnitsItem> *)local_348);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_300);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_2b8);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_270);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemReset.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_1b0);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_168);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &itemImportSource.
              super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::VariablePair>::~shared_ptr
            ((shared_ptr<libcellml::VariablePair> *)local_a8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_70);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &itemComponentEncapsulation.
              super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)
             &itemComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_30);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Annotator, automaticIdAllItemsNoneDuplicated)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringUniqueIds);
    auto annotator = libcellml::Annotator::create();

    auto itemComponent = model->component(0);
    auto itemComponentEncapsulation = model->component("component2");
    auto itemConnection = libcellml::VariablePair::create(
        model->component("component2")->variable(0),
        model->component("component2")->variable(0)->equivalentVariable(0));
    auto itemEncapsulation = model;
    auto itemImportSource = model->component("component1")->importSource();
    auto itemMapVariables = libcellml::VariablePair::create(
        model->component("component2")->variable(1),
        model->component("component2")->variable(1)->equivalentVariable(0));
    auto itemModel = model;
    auto itemReset = model->component("component2")->reset(0);
    auto itemResetValue = model->component("component2")->reset(0);
    auto itemTestValue = model->component("component2")->reset(0);
    auto itemUnitsItem = libcellml::UnitsItem::create(model->units(1), 0);
    auto itemUnits = model->units(1);
    auto itemVariable = model->component("component2")->variable(0);

    annotator->setModel(model);

    EXPECT_EQ(model, owningModel(itemComponent));
    EXPECT_EQ(model, owningModel(itemComponentEncapsulation));
    EXPECT_EQ(model, owningModel(itemConnection->variable1()));
    EXPECT_EQ(model, owningModel(itemMapVariables->variable1()));
    EXPECT_EQ(model, owningModel(itemReset));
    EXPECT_EQ(model, owningModel(itemResetValue));
    EXPECT_EQ(model, owningModel(itemTestValue));
    EXPECT_EQ(model, owningModel(itemUnitsItem->units()));
    EXPECT_EQ(model, owningModel(itemUnits));
    EXPECT_EQ(model, owningModel(itemVariable));

    // Expect each to change, even though the existing identifiers were fine.
    EXPECT_EQ("b4da55", annotator->assignId(itemComponent));
    EXPECT_EQ("b4da56", annotator->assignId(itemComponentEncapsulation));
    EXPECT_EQ("b4da57", annotator->assignId(itemConnection));
    EXPECT_EQ("b4da58", annotator->assignId(itemEncapsulation));
    EXPECT_EQ("b4da59", annotator->assignId(itemImportSource));
    EXPECT_EQ("b4da5a", annotator->assignId(itemMapVariables));
    EXPECT_EQ("b4da5b", annotator->assignId(itemModel));
    EXPECT_EQ("b4da5c", annotator->assignId(itemReset));
    EXPECT_EQ("b4da5d", annotator->assignId(itemResetValue));
    EXPECT_EQ("b4da5e", annotator->assignId(itemTestValue));
    EXPECT_EQ("b4da5f", annotator->assignId(itemUnitsItem));
    EXPECT_EQ("b4da60", annotator->assignId(itemUnits));
    EXPECT_EQ("b4da61", annotator->assignId(itemVariable));
}